

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomAllocFreeTestInstance *this)

{
  Random *rnd;
  pointer *ppMVar1;
  deUint64 *pdVar2;
  void **ppvVar3;
  uint uVar4;
  TestLog *pTVar5;
  pointer pHVar6;
  ulong uVar7;
  unsigned_long uVar8;
  pointer pMVar9;
  pointer pMVar10;
  VkDeviceSize VVar11;
  deUint32 dVar12;
  int iVar13;
  VkResult result;
  VkDevice pVVar14;
  DeviceInterface *pDVar15;
  MessageBuilder *this_00;
  deUint64 dVar16;
  pointer pMVar17;
  InternalError *this_01;
  TestError *this_02;
  pointer pMVar18;
  size_t __n;
  size_t extraout_RDX;
  MemoryObject *__cur;
  pointer pMVar19;
  long lVar20;
  ulong uVar21;
  pointer pMVar22;
  int ndx;
  int max;
  long lVar23;
  pointer this_03;
  ulong uVar24;
  ulong uVar25;
  VkDeviceSize VVar26;
  pointer pMVar27;
  TestStatus *__return_storage_ptr___00;
  byte bVar28;
  bool bVar29;
  allocator<char> local_221;
  pointer local_220;
  ulong local_218;
  TestStatus *local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonEmptyHeaps;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonFullHeaps;
  VkMemoryAllocateInfo alloc;
  
  pVVar14 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar15 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  uVar24 = (this->m_memoryLimits).totalDeviceLocalMemory;
  VVar26 = 0;
  if (uVar24 == 0) {
    VVar26 = this->m_totalDeviceMem;
  }
  lVar23 = VVar26 + this->m_totalSystemMem;
  local_220 = (pointer)(lVar23 + this->m_allocSysMemSize + 0x400);
  uVar21 = (this->m_memoryLimits).totalSystemMemory;
  bVar28 = this->m_totalDeviceMem + 0x10 < uVar24;
  if (uVar24 == 0) {
    bVar28 = local_220 < uVar21;
  }
  pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_opNdx == 0) {
    local_218 = CONCAT44(local_218._4_4_,(uint)bVar28);
    ppvVar3 = &alloc.pNext;
    alloc._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar3);
    std::operator<<((ostream *)ppvVar3,"Performing ");
    this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&alloc,&this->m_opCount);
    std::operator<<((ostream *)&this_00->m_str,
                    " random VkAllocMemory() / VkFreeMemory() calls before freeing all memory.");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar3);
    ppvVar3 = &alloc.pNext;
    alloc._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar3);
    std::operator<<((ostream *)ppvVar3,"Using max 1/8 of the memory in each memory heap.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar3);
    bVar28 = (byte)local_218;
  }
  bVar29 = uVar21 <= local_220;
  local_218 = CONCAT71(local_218._1_7_,bVar29);
  alloc._0_8_ = 0;
  local_210 = __return_storage_ptr__;
  while( true ) {
    __return_storage_ptr___00 = local_210;
    pHVar6 = (this->m_heaps).
             super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_heaps).
                       super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar6) / 0x50) <=
        (ulong)alloc._0_8_) break;
    uVar4 = pHVar6[alloc._0_8_].heap.flags;
    uVar25 = pHVar6[alloc._0_8_].memoryUsage;
    uVar7 = pHVar6[alloc._0_8_].maxMemoryUsage;
    if (uVar25 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&nonEmptyHeaps,(value_type_conflict4 *)&alloc);
    }
    if ((uVar25 < uVar7) &&
       ((((uVar24 == 0 | bVar28 ^ 1 | (uVar4 & 1) == 0) & (uVar24 != 0 || bVar29)) != 1 ||
        (((uVar24 == 0 | (byte)local_218 | (byte)uVar4) & 1) == 0)))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&nonFullHeaps,(value_type_conflict4 *)&alloc);
    }
    alloc._0_8_ = alloc._0_8_ + 1;
  }
  if (this->m_opNdx < this->m_opCount) {
    if (nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (((nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) && (this->m_memoryObjectCount < 4000)) &&
         (local_220 < uVar21)) {
        bVar29 = de::Random::getBool(&this->m_rng);
        if (bVar29) goto LAB_0063c885;
      }
      goto LAB_0063c926;
    }
LAB_0063c885:
    rnd = &this->m_rng;
    dVar12 = deRandom_getUint32(&rnd->m_rnd);
    max = 0;
    pHVar6 = (this->m_heaps).
             super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)dVar12 %
             ((ulong)((long)nonFullHeaps.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)nonFullHeaps.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3 & 0xffffffff)];
    pMVar19 = *(pointer *)
               &pHVar6[uVar8].types.
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                ._M_impl;
    pMVar9 = pHVar6[uVar8].types.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    alloc.pNext = (void *)((ulong)alloc.pNext._4_4_ << 0x20);
    alloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    alloc._4_4_ = 0;
    for (; pMVar27 = (pointer)alloc._0_8_, pMVar19 != pMVar9; pMVar19 = pMVar19 + 1) {
      iVar13 = max;
      if (max < 1) {
LAB_0063c8f5:
        *(deUint32 *)((long)&alloc.pNext + (long)iVar13 * 0xc) = (pMVar19->type).heapIndex;
        *(undefined8 *)(&alloc.sType + (long)iVar13 * 3) = *(undefined8 *)pMVar19;
      }
      else {
        iVar13 = de::Random::getInt(rnd,0,max);
        if (iVar13 < 1) goto LAB_0063c8f5;
      }
      max = max + 1;
    }
    uVar4 = pHVar6[uVar8].heap.flags;
    local_218 = (ulong)uVar4;
    if ((uVar4 & 1) == 0 || uVar24 == 0) {
      uVar24 = (this->m_memoryLimits).totalSystemMemory - (lVar23 + this->m_allocSysMemSize);
    }
    else {
      uVar24 = (this->m_memoryLimits).totalDeviceLocalMemory - this->m_totalDeviceMem;
    }
    uVar21 = pHVar6[uVar8].maxMemoryUsage - pHVar6[uVar8].memoryUsage;
    dVar16 = de::Random::getUint64(rnd);
    if (uVar21 < uVar24) {
      uVar24 = uVar21;
    }
    __n = dVar16 % uVar24;
    if ((__n != 0) && (pHVar6[uVar8].maxMemoryUsage - pHVar6[uVar8].memoryUsage <= __n)) {
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_01,"Test Error: trying to allocate memory more than the available heap size.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x1bd);
      __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    VVar26 = __n + 1;
    pMVar10 = pHVar6[uVar8].objects.
              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar10 ==
        pHVar6[uVar8].objects.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_03 = pHVar6[uVar8].objects.
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pMVar10 - (long)this_03 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar21 = (long)pMVar10 - (long)this_03 >> 4;
      uVar24 = 1;
      if (pMVar10 != this_03) {
        uVar24 = uVar21;
      }
      uVar25 = uVar24 + uVar21;
      if (0x7fffffffffffffe < uVar25) {
        uVar25 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar24,uVar21)) {
        uVar25 = 0x7ffffffffffffff;
      }
      if (uVar25 == 0) {
        pMVar17 = (pointer)0x0;
      }
      else {
        local_220 = this_03;
        pMVar17 = (pointer)operator_new(uVar25 << 4);
        __n = extraout_RDX;
        this_03 = local_220;
      }
      pMVar17[uVar21].memory.m_internal = 0;
      pMVar17[uVar21].size = VVar26;
      pMVar22 = pMVar17;
      for (pMVar18 = this_03; pMVar18 != pMVar10; pMVar18 = pMVar18 + 1) {
        VVar11 = pMVar18->size;
        (pMVar22->memory).m_internal = (pMVar18->memory).m_internal;
        pMVar22->size = VVar11;
        pMVar22 = pMVar22 + 1;
      }
      local_220 = pMVar27;
      std::
      _Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ::_M_deallocate((_Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                       *)this_03,
                      (pointer)((long)pHVar6[uVar8].objects.
                                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)this_03 >> 4),__n);
      pHVar6[uVar8].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar17;
      pHVar6[uVar8].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar22 + 1;
      pHVar6[uVar8].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar17 + uVar25;
      pMVar27 = local_220;
    }
    else {
      (pMVar10->memory).m_internal = 0;
      pMVar10->size = VVar26;
      pHVar6[uVar8].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar10 + 1;
      pMVar22 = pMVar10;
    }
    alloc.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    alloc.pNext = (void *)0x0;
    alloc.memoryTypeIndex = (deUint32)pMVar27;
    alloc.allocationSize = VVar26;
    result = (*pDVar15->_vptr_DeviceInterface[5])(pDVar15,pVVar14,&alloc,0,pMVar22);
    __return_storage_ptr___00 = local_210;
    ::vk::checkResult(result,
                      "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &heap.objects.back().memory)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                      ,0x1cf);
    if (pHVar6[uVar8].objects.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].memory.m_internal == 0) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,(char *)0x0,"!!heap.objects.back().memory",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x1d0);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this->m_memoryObjectCount = this->m_memoryObjectCount + 1;
    pHVar6[uVar8].memoryUsage = VVar26 + pHVar6[uVar8].memoryUsage;
    (&this->m_totalSystemMem)[(uint)local_218 & 1] =
         VVar26 + (&this->m_totalSystemMem)[(uint)local_218 & 1];
    this->m_totalSystemMem = this->m_totalSystemMem + this->m_allocSysMemSize;
  }
  else {
    if (nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&alloc,"Pass",&local_221);
      tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&alloc);
      std::__cxx11::string::~string((string *)&alloc);
      goto LAB_0063cc09;
    }
LAB_0063c926:
    dVar12 = deRandom_getUint32(&(this->m_rng).m_rnd);
    uVar8 = nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start
            [(ulong)dVar12 %
             ((ulong)((long)nonEmptyHeaps.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)nonEmptyHeaps.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3 & 0xffffffff)];
    pHVar6 = (this->m_heaps).
             super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar12 = deRandom_getUint32(&(this->m_rng).m_rnd);
    lVar23 = *(long *)&pHVar6[uVar8].objects.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                       ._M_impl.super__Vector_impl_data;
    lVar20 = ((ulong)dVar12 %
             (ulong)((long)pHVar6[uVar8].objects.
                           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar23 >> 4)) * 0x10;
    uVar4 = pHVar6[uVar8].heap.flags;
    (*pDVar15->_vptr_DeviceInterface[6])(pDVar15,pVVar14,*(undefined8 *)(lVar23 + lVar20),0);
    *(undefined8 *)(lVar23 + lVar20) = 0;
    this->m_memoryObjectCount = this->m_memoryObjectCount - 1;
    lVar23 = ((undefined8 *)(lVar23 + lVar20))[1];
    pHVar6[uVar8].memoryUsage = pHVar6[uVar8].memoryUsage - lVar23;
    (&this->m_totalSystemMem)[uVar4 & 1] = (&this->m_totalSystemMem)[uVar4 & 1] - lVar23;
    this->m_totalSystemMem = this->m_totalSystemMem - this->m_allocSysMemSize;
    pMVar27 = pHVar6[uVar8].objects.
              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar16 = pMVar27[-1].size;
    pdVar2 = (deUint64 *)
             (*(long *)&pHVar6[uVar8].objects.
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                        ._M_impl.super__Vector_impl_data + lVar20);
    *pdVar2 = pMVar27[-1].memory.m_internal;
    pdVar2[1] = dVar16;
    ppMVar1 = &pHVar6[uVar8].objects.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + -1;
  }
  this->m_opNdx = this->m_opNdx + 1;
  tcu::TestStatus::incomplete();
LAB_0063cc09:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nonEmptyHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nonFullHeaps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus RandomAllocFreeTestInstance::iterate (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	vkd				= m_context.getDeviceInterface();
	TestLog&				log				= m_context.getTestContext().getLog();
	const bool				isUMA			= m_memoryLimits.totalDeviceLocalMemory == 0;
	const VkDeviceSize		usedSysMem		= isUMA ? (m_totalDeviceMem+m_totalSystemMem) : m_totalSystemMem;
	const bool				canAllocateSys	= usedSysMem + m_allocSysMemSize + 1024 < m_memoryLimits.totalSystemMemory; // \note Always leave room for 1 KiB sys mem alloc
	const bool				canAllocateDev	= isUMA ? canAllocateSys : (m_totalDeviceMem + 16 < m_memoryLimits.totalDeviceLocalMemory);
	vector<size_t>			nonFullHeaps;
	vector<size_t>			nonEmptyHeaps;
	bool					allocateMore;

	if (m_opNdx == 0)
	{
		log << TestLog::Message << "Performing " << m_opCount << " random VkAllocMemory() / VkFreeMemory() calls before freeing all memory." << TestLog::EndMessage;
		log << TestLog::Message << "Using max 1/8 of the memory in each memory heap." << TestLog::EndMessage;
	}

	// Sort heaps based on whether allocations or frees are possible
	for (size_t heapNdx = 0; heapNdx < m_heaps.size(); ++heapNdx)
	{
		const bool	isDeviceLocal	= (m_heaps[heapNdx].heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;
		const bool	isHeapFull		= m_heaps[heapNdx].memoryUsage >= m_heaps[heapNdx].maxMemoryUsage;
		const bool	isHeapEmpty		= m_heaps[heapNdx].memoryUsage == 0;

		if (!isHeapEmpty)
			nonEmptyHeaps.push_back(heapNdx);

		if (!isHeapFull && ((isUMA && canAllocateSys) ||
							(!isUMA && isDeviceLocal && canAllocateDev) ||
							(!isUMA && !isDeviceLocal && canAllocateSys)))
			nonFullHeaps.push_back(heapNdx);
	}

	if (m_opNdx >= m_opCount)
	{
		if (nonEmptyHeaps.empty())
			return tcu::TestStatus::pass("Pass");
		else
			allocateMore = false;
	}
	else if (!nonEmptyHeaps.empty() &&
			 !nonFullHeaps.empty() &&
			 (m_memoryObjectCount < MAX_ALLOCATION_COUNT) &&
			 canAllocateSys)
		allocateMore = m_rng.getBool(); // Randomize if both operations are doable.
	else if (nonEmptyHeaps.empty())
	{
		DE_ASSERT(canAllocateSys);
		allocateMore = true; // Allocate more if there are no objects to free.
	}
	else if (nonFullHeaps.empty() || !canAllocateSys)
		allocateMore = false; // Free objects if there is no free space for new objects.
	else
	{
		allocateMore = false;
		DE_FATAL("Fail");
	}

	if (allocateMore)
	{
		const size_t		nonFullHeapNdx	= (size_t)(m_rng.getUint32() % (deUint32)nonFullHeaps.size());
		const size_t		heapNdx			= nonFullHeaps[nonFullHeapNdx];
		Heap&				heap			= m_heaps[heapNdx];
		const MemoryType&	memoryType		= m_rng.choose<MemoryType>(heap.types.begin(), heap.types.end());
		const bool			isDeviceLocal	= (heap.heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;
		const VkDeviceSize	maxAllocSize	= (isDeviceLocal && !isUMA)
											? de::min(heap.maxMemoryUsage - heap.memoryUsage, (VkDeviceSize)m_memoryLimits.totalDeviceLocalMemory - m_totalDeviceMem)
											: de::min(heap.maxMemoryUsage - heap.memoryUsage, (VkDeviceSize)m_memoryLimits.totalSystemMemory - usedSysMem - m_allocSysMemSize);
		const VkDeviceSize	allocationSize	= 1 + (m_rng.getUint64() % maxAllocSize);

		if ((allocationSize > (deUint64)(heap.maxMemoryUsage - heap.memoryUsage)) && (allocationSize != 1))
			TCU_THROW(InternalError, "Test Error: trying to allocate memory more than the available heap size.");

		const MemoryObject object =
		{
			(VkDeviceMemory)0,
			allocationSize
		};

		heap.objects.push_back(object);

		const VkMemoryAllocateInfo alloc =
		{
			VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
			DE_NULL,								// pNext
			object.size,							// allocationSize
			memoryType.index						// memoryTypeIndex;
		};

		VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &heap.objects.back().memory));
		TCU_CHECK(!!heap.objects.back().memory);
		m_memoryObjectCount++;

		heap.memoryUsage										+= allocationSize;
		(isDeviceLocal ? m_totalDeviceMem : m_totalSystemMem)	+= allocationSize;
		m_totalSystemMem										+= m_allocSysMemSize;
	}
	else
	{
		const size_t		nonEmptyHeapNdx	= (size_t)(m_rng.getUint32() % (deUint32)nonEmptyHeaps.size());
		const size_t		heapNdx			= nonEmptyHeaps[nonEmptyHeapNdx];
		Heap&				heap			= m_heaps[heapNdx];
		const size_t		memoryObjectNdx	= m_rng.getUint32() % heap.objects.size();
		MemoryObject&		memoryObject	= heap.objects[memoryObjectNdx];
		const bool			isDeviceLocal	= (heap.heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;

		vkd.freeMemory(device, memoryObject.memory, (const VkAllocationCallbacks*)DE_NULL);
		memoryObject.memory = (VkDeviceMemory)0;
		m_memoryObjectCount--;

		heap.memoryUsage										-= memoryObject.size;
		(isDeviceLocal ? m_totalDeviceMem : m_totalSystemMem)	-= memoryObject.size;
		m_totalSystemMem										-= m_allocSysMemSize;

		heap.objects[memoryObjectNdx] = heap.objects.back();
		heap.objects.pop_back();

		DE_ASSERT(heap.memoryUsage == 0 || !heap.objects.empty());
	}

	m_opNdx++;
	return tcu::TestStatus::incomplete();
}